

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions.cpp
# Opt level: O0

vector<State_*,_std::allocator<State_*>_> *
vectorUnion(vector<State_*,_std::allocator<State_*>_> *__return_storage_ptr__,
           vector<State_*,_std::allocator<State_*>_> *a,vector<State_*,_std::allocator<State_*>_> *b
           )

{
  bool bVar1;
  reference ppSVar2;
  State *local_78;
  State *state_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<State_*,_std::allocator<State_*>_> *__range1_1;
  State *local_48;
  State *state;
  const_iterator __end1;
  const_iterator __begin1;
  vector<State_*,_std::allocator<State_*>_> *__range1;
  vector<State_*,_std::allocator<State_*>_> *b_local;
  vector<State_*,_std::allocator<State_*>_> *a_local;
  vector<State_*,_std::allocator<State_*>_> *vecUnion;
  
  memset(__return_storage_ptr__,0,0x18);
  std::vector<State_*,_std::allocator<State_*>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<State_*,_std::allocator<State_*>_>::begin(a);
  state = (State *)std::vector<State_*,_std::allocator<State_*>_>::end(a);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<State_*const_*,_std::vector<State_*,_std::allocator<State_*>_>_>
                                     *)&state), bVar1) {
    ppSVar2 = __gnu_cxx::
              __normal_iterator<State_*const_*,_std::vector<State_*,_std::allocator<State_*>_>_>::
              operator*(&__end1);
    local_48 = *ppSVar2;
    std::vector<State*,std::allocator<State*>>::emplace_back<State*&>
              ((vector<State*,std::allocator<State*>> *)__return_storage_ptr__,&local_48);
    __gnu_cxx::__normal_iterator<State_*const_*,_std::vector<State_*,_std::allocator<State_*>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::vector<State_*,_std::allocator<State_*>_>::begin(b);
  state_1 = (State *)std::vector<State_*,_std::allocator<State_*>_>::end(b);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<State_*const_*,_std::vector<State_*,_std::allocator<State_*>_>_>
                             *)&state_1), bVar1) {
    ppSVar2 = __gnu_cxx::
              __normal_iterator<State_*const_*,_std::vector<State_*,_std::allocator<State_*>_>_>::
              operator*(&__end1_1);
    local_78 = *ppSVar2;
    std::vector<State*,std::allocator<State*>>::emplace_back<State*&>
              ((vector<State*,std::allocator<State*>> *)__return_storage_ptr__,&local_78);
    __gnu_cxx::__normal_iterator<State_*const_*,_std::vector<State_*,_std::allocator<State_*>_>_>::
    operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<State *> vectorUnion(const std::vector<State *> &a, const std::vector<State *> &b) {

    std::vector<State *> vecUnion = {};

    for (State *state: a) {
        vecUnion.emplace_back(state);
    }

    for (State *state: b) {
        vecUnion.emplace_back(state);
    }

    return vecUnion;
}